

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_recursive_cte.hpp
# Opt level: O2

void __thiscall duckdb::LogicalRecursiveCTE::~LogicalRecursiveCTE(LogicalRecursiveCTE *this)

{
  ~LogicalRecursiveCTE(this);
  operator_delete(this);
  return;
}

Assistant:

LogicalRecursiveCTE() : LogicalOperator(LogicalOperatorType::LOGICAL_RECURSIVE_CTE) {
	}